

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleTable::childAt(QAccessibleTable *this,int x,int y)

{
  int iVar1;
  QAbstractScrollArea *this_00;
  QWidget *pQVar2;
  QWidget *parent;
  QPoint QVar3;
  QAbstractItemView *pQVar4;
  QAccessibleInterface *pQVar5;
  long in_FS_OFFSET;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAbstractScrollArea *)view(this);
  pQVar2 = QAbstractScrollArea::viewport(this_00);
  parent = (QWidget *)view(this);
  local_58 = (undefined1 *)0x0;
  QVar3 = QWidget::mapTo(pQVar2,parent,(QPoint *)&local_58);
  pQVar2 = (QWidget *)view(this);
  local_58._0_4_ = x - QVar3.xp.m_i;
  local_58._4_4_ = y - QVar3.yp.m_i;
  local_40 = QWidget::mapFromGlobal(pQVar2,(QPoint *)&local_58);
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = view(this);
  (**(code **)(*(long *)&(pQVar4->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x1f0))
            (&local_58,pQVar4,&local_40);
  pQVar5 = (QAccessibleInterface *)0x0;
  if (((-1 < local_58._0_4_) && (-1 < (long)local_58)) &&
     (local_48.ptr != (QAbstractItemModel *)0x0)) {
    iVar1 = logicalIndex(this,(QModelIndex *)&local_58);
    pQVar5 = (QAccessibleInterface *)(**(code **)(*(long *)this + 0x100))(this,iVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTable::childAt(int x, int y) const
{
    QPoint viewportOffset = view()->viewport()->mapTo(view(), QPoint(0,0));
    QPoint indexPosition = view()->mapFromGlobal(QPoint(x, y) - viewportOffset);
    // FIXME: if indexPosition < 0 in one coordinate, return header

    const QModelIndex index = view()->indexAt(indexPosition);
    if (index.isValid())
        return child(logicalIndex(index));
    return nullptr;
}